

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O2

XXH64_hash_t XXH3_64bits_withSeed(void *data,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  XXH64_hash_t XVar19;
  long lVar20;
  ulong uVar21;
  BYTE *p;
  ulong uVar22;
  
  if (len < 0x11) {
    if (8 < len) {
      uVar22 = *data + seed + 0x23a44bbeb8fe6c39;
      uVar21 = (*(long *)((long)data + (len - 8)) - seed) + 0xf721ad1c7c01812c;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar21;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar22;
      uVar21 = uVar22 + len + uVar21 + SUB168(auVar1 * auVar10,0) + SUB168(auVar1 * auVar10,8);
      uVar21 = uVar21 >> 0x1d ^ uVar21;
      goto LAB_00107047;
    }
    if (3 < len) {
      uVar21 = (ulong)(uint)((int)seed + -0x470193c7 + *data);
      uVar21 = uVar21 + len +
               (uVar21 + 0x100000000) * (ulong)(*(int *)((long)data + (len - 4)) + 0x23a44bbe);
      uVar21 = (uVar21 >> 0x1d ^ uVar21) * 0x165667b19e3779f9;
      return uVar21 >> 0x20 ^ uVar21;
    }
    if (len == 0) {
      return seed;
    }
    uVar21 = (len + 0x23a44bbe + (ulong)*(byte *)((long)data + (len - 1)) * 4) *
             (ulong)((int)seed + -0x470193c7 +
                    (uint)CONCAT11(*(undefined1 *)((long)data + (len >> 1)),*data));
  }
  else {
    lVar20 = len * -0x61c8864e7a143579;
    if (0x20 < len) {
      if (0x40 < len) {
        if (0x60 < len) {
          if (0x80 < len) {
            XVar19 = XXH3_hashLong_64b(data,len,seed);
            return XVar19;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = 0xc70b4f1df9dcbbc7 - seed ^ *(ulong *)((long)data + 0x38);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = seed + 0xe39c343fa8fa763f ^ *(ulong *)((long)data + 0x30);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = 0xd9787364c89f7ec9 - seed ^ *(ulong *)((long)data + (len - 0x38));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = seed + 0xcdb459318a51e04b ^ *(ulong *)((long)data + (len - 0x40));
          lVar20 = lVar20 + SUB168(auVar2 * auVar11,0) + SUB168(auVar2 * auVar11,8) +
                   SUB168(auVar3 * auVar12,0) + SUB168(auVar3 * auVar12,8);
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = 0x1b532ea388d0658b - seed ^ *(ulong *)((long)data + 0x28);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = seed + 0x91c300cb3c2852bb ^ *(ulong *)((long)data + 0x20);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = 0xa9deacd83819ef46 - seed ^ *(ulong *)((long)data + (len - 0x28));
        auVar14._8_8_ = 0;
        auVar14._0_8_ = seed + 0xa20df94e71644897 ^ *(ulong *)((long)data + (len - 0x30));
        lVar20 = SUB168(auVar5 * auVar14,0) + SUB168(auVar5 * auVar14,8) +
                 SUB168(auVar4 * auVar13,0) + lVar20 + SUB168(auVar4 * auVar13,8);
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = 0xccff7221825ad07d - seed ^ *(ulong *)((long)data + 0x18);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = seed + 0xccc0e578cb79e64e ^ *(ulong *)((long)data + 0x10);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = 0x813a264ce03590e6 - seed ^ *(ulong *)((long)data + (len - 0x18));
      auVar16._8_8_ = 0;
      auVar16._0_8_ = seed + 0xf743248eb8084674 ^ *(ulong *)((long)data + (len - 0x20));
      lVar20 = SUB168(auVar7 * auVar16,0) + SUB168(auVar7 * auVar16,8) +
               SUB168(auVar6 * auVar15,0) + lVar20 + SUB168(auVar6 * auVar15,8);
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = 0xf721ad1c7c01812c - seed ^ *(ulong *)((long)data + 8);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = seed + 0x23a44bbeb8fe6c39 ^ *data;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = 0xb7b3671f7240a4a4 - seed ^ *(ulong *)((long)data + (len - 8));
    auVar18._8_8_ = 0;
    auVar18._0_8_ = seed + 0x839097dbded46de9 ^ *(ulong *)((long)data + (len - 0x10));
    uVar21 = SUB168(auVar9 * auVar18,0) + SUB168(auVar9 * auVar18,8) +
             SUB168(auVar8 * auVar17,0) + lVar20 + SUB168(auVar8 * auVar17,8);
  }
  uVar21 = uVar21 >> 0x1d ^ uVar21;
LAB_00107047:
  return uVar21 * 0x165667b19e3779f9 >> 0x20 ^ uVar21 * 0x165667b19e3779f9;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* data, size_t len, XXH64_hash_t seed)
{
    const BYTE* const p = (const BYTE*)data;
    const char* const key = (const char*)kKey;

    if (len <= 16) return XXH3_len_0to16_64b(data, len, seed);

    {   U64 acc = PRIME64_1 * len;
        if (len > 32) {
            if (len > 64) {
                if (len > 96) {
                    if (len > 128) return XXH3_hashLong_64b(data, len, seed);

                    acc += XXH3_mix16B(p+48, key+96, seed);
                    acc += XXH3_mix16B(p+len-64, key+112, seed);
                }

                acc += XXH3_mix16B(p+32, key+64, seed);
                acc += XXH3_mix16B(p+len-48, key+80, seed);
            }

            acc += XXH3_mix16B(p+16, key+32, seed);
            acc += XXH3_mix16B(p+len-32, key+48, seed);
        }

        acc += XXH3_mix16B(p+0, key+0, seed);
        acc += XXH3_mix16B(p+len-16, key+16, seed);

        return XXH3_avalanche(acc);
    }
}